

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O2

void __thiscall
Object::projectEdge2Edge(Object *this,Edge *src,Vector2d *obs,Edge *dst,HeapType *heap)

{
  iterator *this_00;
  int iVar1;
  double dVar2;
  _Elt_pointer pMVar3;
  RealScalar RVar4;
  double dVar5;
  pointer pMVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  PointerType ptr_1;
  _Elt_pointer pMVar13;
  size_type sVar14;
  reference pMVar15;
  reference pMVar16;
  _Elt_pointer pMVar17;
  undefined4 *puVar18;
  double *pdVar19;
  double *__args_1;
  Edge *__range2;
  _Elt_pointer pMVar20;
  Vector2d *pVVar21;
  Object *this_01;
  Object *pOVar22;
  PointerType ptr_2;
  pointer pMVar23;
  _Map_pointer ppMVar24;
  Vector3d *pt;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  tasks;
  Vector2d ept;
  double e_ang;
  double f_ang;
  Vector2d fpt;
  Vector2d dst_b;
  Vector2d dst_f;
  Vector3d tmp;
  Vector2d local_68;
  Vector2d local_58;
  Vector2d local_48;
  
  pMVar17 = (src->
            super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ).
            super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  dVar2 = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [0];
  dVar5 = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [1];
  fpt.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0] - dVar2;
  fpt.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1] - dVar5;
  pMVar13 = (src->
            super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ).
            super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pMVar3 = (src->
           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ).
           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  pMVar20 = pMVar13;
  if (pMVar13 == pMVar3) {
    pMVar20 = (src->
              super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ).
              super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  ept.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       pMVar20[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
       array[0] - dVar2;
  ept.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       pMVar20[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
       array[1] - dVar5;
  f_ang = (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2];
  if (pMVar13 == pMVar3) {
    pMVar13 = (src->
              super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ).
              super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  pOVar22 = (Object *)
            &(src->
             super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ).
             super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_start;
  dVar2 = pMVar13[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2];
  e_ang = dVar2;
  bVar7 = Edge::angleInRange(dst,f_ang);
  bVar8 = Edge::angleInRange(dst,dVar2);
  sVar14 = std::
           deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::size(&src->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 );
  if (sVar14 < 3) {
    if (bVar7 && bVar8) {
LAB_0010b874:
      tasks.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tasks.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tasks.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0] = fpt.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
            [0];
      local_48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1] = fpt.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
            [1];
      local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0] = ept.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
            [0];
      local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1] = ept.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
            [1];
      local_68.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0] = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
            array[0];
      local_68.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1] = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
            array[1];
      bVar7 = breakEdge(this,&local_48,&local_58,&local_68,dst,heap);
      if (bVar7) goto LAB_0010b8bd;
      goto LAB_0010b8f3;
    }
LAB_0010b8d9:
    tasks.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tasks.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tasks.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    __args_1 = fpt.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
               array + 1;
    if (bVar7) {
      pdVar19 = &f_ang;
      pVVar21 = &fpt;
      goto LAB_0010b91b;
    }
    if (bVar8) {
      std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      emplace_back<double&,double&,double&>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&tasks,(double *)&ept,
                 ept.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                 array + 1,&e_ang);
      bVar7 = false;
    }
    else {
      pMVar17 = (dst->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      dVar2 = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[0];
      dVar5 = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[1];
      dst_f.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
           (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0] - dVar2;
      dst_f.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
           (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1] - dVar5;
      pMVar13 = (dst->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pMVar13 ==
          (dst->
          super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ).
          super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pMVar13 = (dst->
                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ).
                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      dst_b.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
           pMVar13[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
           .array[0] - dVar2;
      dst_b.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
           pMVar13[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
           .array[1] - dVar5;
      uVar11 = Edge::rotatedBinarySearch
                         (src,(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              ).m_storage.m_data.array[2]);
      bVar7 = (int)uVar11 < 1;
      if (0 < (int)uVar11) {
        pMVar15 = std::
                  _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                  ::operator[]((_Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                                *)pOVar22,(ulong)(uVar11 - 1));
        this_01 = pOVar22;
        pMVar16 = std::
                  _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                  ::operator[]((_Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                                *)pOVar22,(ulong)uVar11);
        bVar8 = rangeSuitable(this_01,pMVar15,pMVar16,&dst_f,obs,&tmp);
        if (bVar8) goto LAB_0010b8bd;
      }
      pMVar17 = (dst->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pMVar17 ==
          (dst->
          super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ).
          super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pMVar17 = (dst->
                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ).
                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      uVar12 = Edge::rotatedBinarySearch
                         (src,pMVar17[-1].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array[2]);
      if ((int)uVar12 < 1) {
        if ((int)uVar11 < 1) goto LAB_0010b8bd;
        pdVar19 = &e_ang;
        pVVar21 = &ept;
        __args_1 = ept.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
                   .array + 1;
      }
      else {
        pMVar15 = std::
                  _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                  ::operator[]((_Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                                *)pOVar22,(ulong)(uVar12 - 1));
        pMVar16 = std::
                  _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                  ::operator[]((_Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                                *)pOVar22,(ulong)uVar12);
        bVar8 = rangeSuitable(pOVar22,pMVar15,pMVar16,&dst_b,obs,&tmp);
        if (bVar8) goto LAB_0010b8bd;
        if (0 < (int)uVar11) {
          dst->valid = false;
          goto LAB_0010b8bd;
        }
        pdVar19 = &f_ang;
        pVVar21 = &fpt;
      }
      std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      emplace_back<double&,double&,double&>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&tasks,(double *)pVVar21,__args_1,pdVar19);
    }
  }
  else {
    sVar14 = std::
             deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::size(&src->
                     super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   );
    pMVar15 = std::
              _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
              ::operator[]((_Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                            *)pOVar22,sVar14 >> 1);
    bVar9 = Edge::angleInRange(dst,(pMVar15->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[2]);
    tasks.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tasks.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tasks.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (!bVar7 || !bVar8) goto LAB_0010b8d9;
    if (bVar9) goto LAB_0010b874;
LAB_0010b8f3:
    std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
    emplace_back<double&,double&,double&>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&tasks,(double *)&fpt,
               fpt.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
               array + 1,&f_ang);
    pdVar19 = &e_ang;
    pVVar21 = &ept;
    __args_1 = ept.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
               array + 1;
LAB_0010b91b:
    bVar7 = true;
    std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
    emplace_back<double&,double&,double&>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&tasks,(double *)pVVar21,__args_1,pdVar19);
  }
  pMVar6 = tasks.
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &(dst->
             super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ).
             super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_start;
  iVar1 = 0;
  for (pMVar23 = tasks.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pMVar23 != pMVar6; pMVar23 = pMVar23 + 1
      ) {
    dst_b.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         (pMVar23->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
         array[0];
    dst_b.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         (pMVar23->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
         array[1];
    iVar10 = Edge::rotatedBinarySearch
                       (dst,(pMVar23->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                            m_storage.m_data.array[2]);
    if ((iVar1 == 0) && (iVar10 < 1)) {
      puVar18 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar18 = 0;
      __cxa_throw(puVar18,&int::typeinfo,0);
    }
    if ((iVar1 != 0) && (iVar10 < 1)) break;
    tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0
    ;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&dst_f,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&tmp);
    pMVar15 = std::
              _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
              ::operator[](this_00,(long)(iVar10 + -1));
    pOVar22 = (Object *)this_00;
    pMVar16 = std::
              _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
              ::operator[](this_00,(long)iVar10);
    bVar8 = rangeSuitable(pOVar22,pMVar15,pMVar16,&dst_b,obs,(Vector3d *)&dst_f);
    if (!bVar8) break;
    bVar7 = (bool)(bVar7 & iVar1 == 0);
    if (bVar7) {
      sVar14 = std::
               deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ::size(&dst->
                       super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     );
      iVar10 = (int)sVar14 - iVar10;
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      while (bVar8 = iVar10 != 0, iVar10 = iVar10 + -1, bVar8) {
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::pop_back(&dst->
                    super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  );
      }
      std::deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      emplace_back<Eigen::Matrix<double,3,1,0,3,1>&>
                ((deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)dst,(Matrix<double,_3,_1,_0,_3,_1> *)&dst_f);
    }
    else {
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      while (bVar8 = iVar10 != 0, iVar10 = iVar10 + -1, bVar8) {
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::pop_front(&dst->
                     super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   );
      }
      std::deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      emplace_front<Eigen::Matrix<double,3,1,0,3,1>&>
                ((deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)dst,(Matrix<double,_3,_1,_0,_3,_1> *)&dst_f);
    }
    pMVar13 = (dst->
              super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ).
              super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pMVar17 = (dst->
              super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ).
              super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppMVar24 = (dst->
               super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ).
               super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    pMVar3 = (dst->
             super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ).
             super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    while (pMVar13 != pMVar3) {
      tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
           (double)pMVar13;
      tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
           (double)pMVar13;
      RVar4 = Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                      *)&tmp);
      if (RVar4 < dst->min_dist) {
        dst->min_dist = RVar4;
      }
      pMVar13 = pMVar13 + 1;
      if (pMVar13 == pMVar17) {
        pMVar13 = ppMVar24[1];
        ppMVar24 = ppMVar24 + 1;
        pMVar17 = pMVar13 + 0x15;
      }
    }
    iVar1 = iVar1 + 1;
  }
LAB_0010b8bd:
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&tasks.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 );
  return;
}

Assistant:

void Object::projectEdge2Edge(const Edge& src, const Eigen::Vector2d& obs, Edge& dst, HeapType& heap) {
    bool pop_back_flag = true;
    Eigen::Vector2d fpt = src.front().block<2, 1>(0, 0) - obs, ept = src.back().block<2, 1>(0, 0) - obs;
    double f_ang = src.front().z(), e_ang = src.back().z();
    bool head_in_range = dst.angleInRange(f_ang), end_in_range = dst.angleInRange(e_ang), mid_in_range = true;
    if (src.size() > 2) {
        size_t mid_id = src.size() / 2;
        mid_in_range = dst.angleInRange(src[mid_id].z());
    }
    std::vector<Eigen::Vector3d> tasks;
    if (head_in_range && end_in_range) {        
        if (mid_in_range) {                     // 加edge 打断
            LOG_ERROR_STREAM("Breaking edge!");
            if (breakEdge(fpt, ept, obs, dst, heap) == true)
                return;
        }                          // 特殊情况
        tasks.emplace_back(fpt.x(), fpt.y(), f_ang);
        tasks.emplace_back(ept.x(), ept.y(), e_ang);
    } else if (head_in_range) {
        tasks.emplace_back(fpt.x(), fpt.y(), f_ang);
    } else if (end_in_range) {
        tasks.emplace_back(ept.x(), ept.y(), e_ang);
        pop_back_flag = false;          // pop_front
    } else {                            // SRC的两个端点不在DST范围内（有可能完全遮挡的）
        const Eigen::Vector2d dst_f = dst.front().block<2, 1>(0, 0) - obs, dst_b = dst.back().block<2, 1>(0, 0) - obs;
        int f_id = src.rotatedBinarySearch(dst.front().z());
        if (f_id > 0) {
            Eigen::Vector3d tmp;
            bool dst_closer = rangeSuitable(src[f_id - 1], src[f_id], dst_f, obs, tmp);
            if (dst_closer == true) return;
        }
        int e_id = src.rotatedBinarySearch(dst.back().z());
        if (e_id > 0) {
            Eigen::Vector3d tmp;
            bool dst_closer = rangeSuitable(src[e_id - 1], src[e_id], dst_b, obs, tmp);
            if (dst_closer == true) return;        // 投影边的range更大
        }
        if (f_id <= 0 && e_id <= 0) return;          // 反向光线
        if (f_id > 0 && e_id > 0) {
            dst.valid = false;
            return;
        }
        if (f_id > 0) {
            tasks.emplace_back(ept.x(), ept.y(), e_ang);
            pop_back_flag = false;          // pop_front
        } else {
            tasks.emplace_back(fpt.x(), fpt.y(), f_ang);
        }
    }
    int task_id = 0;
    for (const Eigen::Vector3d& task: tasks) {
        if (task_id > 0) pop_back_flag = false;
        double angle = task.z();
        Eigen::Vector2d beam = task.block<2, 1>(0, 0);
        int id = dst.rotatedBinarySearch(angle);
        if (task_id == 0 && id <= 0) {
            LOG_ERROR_STREAM("Task is 0 and id <= 0");
            throw 0;
        } else if (task_id > 0 && id <= 0) break;
        Eigen::Vector3d intersect = Eigen::Vector3d::Zero();
        if (rangeSuitable(dst[id - 1], dst[id], beam, obs, intersect) == false) {
            return;
        }
        if (pop_back_flag == true) {            // 删除大角度
            int delete_cnt = static_cast<int>(dst.size()) - id;
            for (int i = 0; i < delete_cnt; i++)
                dst.pop_back();
            dst.emplace_back(intersect);
        } else {
            for (int i = 0; i < id; i++) {
                dst.pop_front();
            }
            dst.emplace_front(intersect);
        }
        for (const Eigen::Vector3d& pt: dst) {
            double dist = (pt.block<2, 1>(0, 0) - obs).norm();
            if (dist < dst.min_dist) dst.min_dist = dist;
        }
        task_id ++;
    }
}